

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void checkList(IntegrityCk *pCheck,int isFreeList,int iPage,int N)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  IntegrityCk *pCheck_00;
  uint in_ECX;
  uint in_EDX;
  Pgno in_ESI;
  Pager *in_RDI;
  Pgno iFreePage;
  int n;
  uchar *pOvflData;
  DbPage *pOvflPage;
  int iFirst;
  int expected;
  int i;
  IntegrityCk *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc4;
  u32 in_stack_ffffffffffffffc8;
  u32 in_stack_ffffffffffffffcc;
  DbPage *local_28;
  u32 in_stack_ffffffffffffffe8;
  uint uVar4;
  uint local_10;
  
  uVar4 = in_ECX;
  local_10 = in_EDX;
  while( true ) {
    uVar2 = uVar4 - 1;
    uVar1 = in_stack_ffffffffffffffc4 & 0xffffff;
    if (0 < (int)uVar4) {
      uVar1 = CONCAT13(in_RDI->dbSize != 0,(int3)in_stack_ffffffffffffffc4);
    }
    in_stack_ffffffffffffffc4 = uVar1;
    if ((char)(in_stack_ffffffffffffffc4 >> 0x18) == '\0') {
      return;
    }
    if ((int)local_10 < 1) {
      checkAppendMsg((IntegrityCk *)in_RDI,
                     "%d of %d pages missing from overflow list starting at %d",(ulong)uVar4,
                     (ulong)in_ECX,(ulong)in_EDX);
      return;
    }
    iVar3 = checkRef(in_stack_ffffffffffffffb8,0);
    if (iVar3 != 0) break;
    iVar3 = sqlite3PagerAcquire(in_RDI,in_ESI,(DbPage **)CONCAT44(uVar2,in_stack_ffffffffffffffe8),
                                in_ECX);
    if (iVar3 != 0) {
      checkAppendMsg((IntegrityCk *)in_RDI,"failed to get page %d",(ulong)local_10);
      return;
    }
    pCheck_00 = (IntegrityCk *)sqlite3PagerGetData(local_28);
    if (in_ESI == 0) {
      if ((*(u8 *)((long)&in_RDI->pVfs->pAppData + 1) != '\0') && (0 < (int)uVar2)) {
        in_stack_ffffffffffffffe8 = sqlite3Get4byte((u8 *)pCheck_00);
        checkPtrmap(pCheck_00,in_stack_ffffffffffffffcc,(u8)(in_stack_ffffffffffffffc8 >> 0x18),
                    in_stack_ffffffffffffffc4);
      }
    }
    else {
      in_stack_ffffffffffffffcc = sqlite3Get4byte((u8 *)((long)&pCheck_00->pBt + 4));
      if (*(u8 *)((long)&in_RDI->pVfs->pAppData + 1) != '\0') {
        checkPtrmap(pCheck_00,in_stack_ffffffffffffffcc,(u8)(in_stack_ffffffffffffffc8 >> 0x18),
                    in_stack_ffffffffffffffc4);
      }
      if (*(int *)((long)&in_RDI->pVfs->xDelete + 4) / 4 + -2 < (int)in_stack_ffffffffffffffcc) {
        checkAppendMsg((IntegrityCk *)in_RDI,"freelist leaf count too big on page %d",
                       (ulong)local_10);
        uVar2 = uVar2 - 1;
      }
      else {
        for (in_stack_ffffffffffffffe8 = 0;
            (int)in_stack_ffffffffffffffe8 < (int)in_stack_ffffffffffffffcc;
            in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffe8 + 1) {
          in_stack_ffffffffffffffc8 =
               sqlite3Get4byte((u8 *)((long)&pCheck_00->pBt +
                                     (long)(int)(in_stack_ffffffffffffffe8 * 4 + 8)));
          if (*(u8 *)((long)&in_RDI->pVfs->pAppData + 1) != '\0') {
            checkPtrmap(pCheck_00,in_stack_ffffffffffffffcc,(u8)(in_stack_ffffffffffffffc8 >> 0x18),
                        in_stack_ffffffffffffffc4);
          }
          checkRef(in_stack_ffffffffffffffb8,0);
        }
        uVar2 = uVar2 - in_stack_ffffffffffffffcc;
      }
    }
    local_10 = sqlite3Get4byte((u8 *)pCheck_00);
    sqlite3PagerUnref((DbPage *)0x15af4a);
    uVar4 = uVar2;
  }
  return;
}

Assistant:

static void checkList(
  IntegrityCk *pCheck,  /* Integrity checking context */
  int isFreeList,       /* True for a freelist.  False for overflow page list */
  int iPage,            /* Page number for first page in the list */
  int N                 /* Expected number of pages in the list */
){
  int i;
  int expected = N;
  int iFirst = iPage;
  while( N-- > 0 && pCheck->mxErr ){
    DbPage *pOvflPage;
    unsigned char *pOvflData;
    if( iPage<1 ){
      checkAppendMsg(pCheck,
         "%d of %d pages missing from overflow list starting at %d",
          N+1, expected, iFirst);
      break;
    }
    if( checkRef(pCheck, iPage) ) break;
    if( sqlite3PagerGet(pCheck->pPager, (Pgno)iPage, &pOvflPage) ){
      checkAppendMsg(pCheck, "failed to get page %d", iPage);
      break;
    }
    pOvflData = (unsigned char *)sqlite3PagerGetData(pOvflPage);
    if( isFreeList ){
      int n = get4byte(&pOvflData[4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pCheck->pBt->autoVacuum ){
        checkPtrmap(pCheck, iPage, PTRMAP_FREEPAGE, 0);
      }
#endif
      if( n>(int)pCheck->pBt->usableSize/4-2 ){
        checkAppendMsg(pCheck,
           "freelist leaf count too big on page %d", iPage);
        N--;
      }else{
        for(i=0; i<n; i++){
          Pgno iFreePage = get4byte(&pOvflData[8+i*4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
          if( pCheck->pBt->autoVacuum ){
            checkPtrmap(pCheck, iFreePage, PTRMAP_FREEPAGE, 0);
          }
#endif
          checkRef(pCheck, iFreePage);
        }
        N -= n;
      }
    }
#ifndef SQLITE_OMIT_AUTOVACUUM
    else{
      /* If this database supports auto-vacuum and iPage is not the last
      ** page in this overflow list, check that the pointer-map entry for
      ** the following page matches iPage.
      */
      if( pCheck->pBt->autoVacuum && N>0 ){
        i = get4byte(pOvflData);
        checkPtrmap(pCheck, i, PTRMAP_OVERFLOW2, iPage);
      }
    }
#endif
    iPage = get4byte(pOvflData);
    sqlite3PagerUnref(pOvflPage);
  }
}